

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall
wabt::LoadStoreExpr<(wabt::ExprType)4>::LoadStoreExpr
          (LoadStoreExpr<(wabt::ExprType)4> *this,Opcode opcode,Var *memidx,Address align,
          Address offset,Location *loc)

{
  Var local_80;
  Location *local_38;
  Location *loc_local;
  Address offset_local;
  Address align_local;
  Var *memidx_local;
  LoadStoreExpr<(wabt::ExprType)4> *this_local;
  Opcode opcode_local;
  
  local_38 = loc;
  loc_local = (Location *)offset;
  offset_local = align;
  align_local = (Address)memidx;
  memidx_local = (Var *)this;
  this_local._4_4_ = opcode.enum_;
  Var::Var(&local_80,memidx);
  MemoryExpr<(wabt::ExprType)4>::MemoryExpr
            (&this->super_MemoryExpr<(wabt::ExprType)4>,&local_80,local_38);
  Var::~Var(&local_80);
  (this->super_MemoryExpr<(wabt::ExprType)4>).super_ExprMixin<(wabt::ExprType)4>.super_Expr.
  _vptr_Expr = (_func_int **)&PTR__LoadStoreExpr_00256348;
  (this->opcode).enum_ = this_local._4_4_;
  this->align = offset_local;
  this->offset = (Address)loc_local;
  return;
}

Assistant:

LoadStoreExpr(Opcode opcode,
                Var memidx,
                Address align,
                Address offset,
                const Location& loc = Location())
      : MemoryExpr<TypeEnum>(memidx, loc),
        opcode(opcode),
        align(align),
        offset(offset) {}